

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportTargetCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target)

{
  cmTarget *this_00;
  ostream *poVar1;
  char *pcVar2;
  string config;
  string targetName;
  string local_80;
  string local_60;
  string local_40 [32];
  
  std::__cxx11::string::string
            (local_40,(string *)
                      &(this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.
                       Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_80,target);
  std::__cxx11::string::append(local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator<<(os,"include $(CLEAR_VARS)\n");
  std::operator<<(os,"LOCAL_MODULE := ");
  poVar1 = std::operator<<(os,local_40);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/");
  this_00 = target->Target;
  std::__cxx11::string::string((string *)&local_80,"__dest",(allocator *)&local_60);
  pcVar2 = cmTarget::GetProperty(this_00,&local_80);
  poVar1 = std::operator<<(os,pcVar2);
  std::operator<<(poVar1,"/");
  std::__cxx11::string::~string((string *)&local_80);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  if ((this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)&local_80);
  }
  cmGeneratorTarget::GetFullName(&local_60,target,&local_80,RuntimeBinaryArtifact);
  poVar1 = std::operator<<(os,(string *)&local_60);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, const cmGeneratorTarget* target)
{
  std::string targetName = this->Namespace;
  targetName += target->GetExportName();
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/";
  os << target->Target->GetProperty("__dest") << "/";
  std::string config;
  if (!this->Configurations.empty()) {
    config = this->Configurations[0];
  }
  os << target->GetFullName(config) << "\n";
}